

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void av1_init_plane_quantizers(AV1_COMP *cpi,MACROBLOCK *x,int segment_id,int do_update)

{
  segmentation *seg;
  CommonQuantParams *quant_params;
  FRAME_TYPE frame_type;
  aom_enc_pass aVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  qm_val_t *(*paapqVar12) [3] [19];
  qm_val_t *(*__dest) [19];
  undefined8 local_40;
  int local_38;
  
  iVar4 = (cpi->ppi->p_rc).gfu_boost;
  iVar5 = iVar4 / 100;
  if (0x63f < iVar4) {
    iVar5 = 0xf;
  }
  iVar4 = (cpi->ppi->gf_group).layer_depth[cpi->gf_frame_index];
  iVar7 = 6;
  if (iVar4 < 6) {
    iVar7 = iVar4;
  }
  iVar4 = (cpi->common).quant_params.base_qindex;
  if ((cpi->common).delta_q_info.delta_q_present_flag == 0) {
    iVar3 = 0xff;
    if ((iVar4 < 0x100) && (iVar3 = 0, 0 < iVar4)) {
      iVar3 = iVar4;
    }
  }
  else {
    iVar9 = x->delta_qindex + iVar4;
    iVar3 = 0xff;
    if (iVar9 < 0x100) {
      if (iVar9 < 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = iVar4 + x->delta_qindex;
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
      }
    }
  }
  frame_type = (cpi->common).current_frame.frame_type;
  seg = &(cpi->common).seg;
  iVar3 = av1_get_qindex(seg,segment_id,iVar3);
  iVar4 = iVar3;
  if ((cpi->oxcf).sb_qp_sweep != 0) {
    iVar4 = (cpi->common).quant_params.base_qindex;
    if ((cpi->common).delta_q_info.delta_q_present_flag == 0) {
      iVar9 = 0xff;
      if ((iVar4 < 0x100) && (iVar9 = 0, 0 < iVar4)) {
        iVar9 = iVar4;
      }
    }
    else {
      iVar10 = x->rdmult_delta_qindex + iVar4;
      iVar9 = 0xff;
      if (iVar10 < 0x100) {
        if (iVar10 < 0) {
          iVar9 = 0;
        }
        else {
          iVar9 = iVar4 + x->rdmult_delta_qindex;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
        }
      }
    }
    iVar4 = av1_get_qindex(seg,segment_id,iVar9);
  }
  aVar1 = (cpi->oxcf).pass;
  if (aVar1 < AOM_RC_LAST_PASS) {
    uVar6 = 0;
    if ((aVar1 == AOM_RC_ONE_PASS) && (cpi->compressor_stage == '\0')) {
      uVar6 = (uint)(cpi->ppi->lap_enabled != 0);
    }
  }
  else {
    uVar6 = 1;
  }
  iVar5 = av1_compute_rd_mult((cpi->common).quant_params.y_dc_delta_q + iVar4,
                              ((cpi->common).seq_params)->bit_depth,
                              (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],iVar7,iVar5,
                              frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar6,
                              (cpi->oxcf).tune_cfg.tuning);
  if ((do_update != 0) || (x->qindex != iVar3)) {
    x->qindex = iVar3;
    x->seg_skip_block = 0;
    x->plane[0].quant_QTX = (cpi->enc_quant_dequant_params).quants.y_quant[iVar3];
    x->plane[0].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.y_quant_fp[iVar3];
    x->plane[0].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.y_round_fp[iVar3];
    x->plane[0].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.y_quant_shift[iVar3];
    x->plane[0].zbin_QTX = (cpi->enc_quant_dequant_params).quants.y_zbin[iVar3];
    x->plane[0].round_QTX = (cpi->enc_quant_dequant_params).quants.y_round[iVar3];
    x->plane[0].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.y_dequant_QTX[iVar3];
    x->plane[1].quant_QTX = (cpi->enc_quant_dequant_params).quants.u_quant[iVar3];
    x->plane[1].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.u_quant_fp[iVar3];
    x->plane[1].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.u_round_fp[iVar3];
    x->plane[1].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.u_quant_shift[iVar3];
    x->plane[1].zbin_QTX = (cpi->enc_quant_dequant_params).quants.u_zbin[iVar3];
    x->plane[1].round_QTX = (cpi->enc_quant_dequant_params).quants.u_round[iVar3];
    x->plane[1].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.u_dequant_QTX[iVar3];
    x->plane[2].quant_QTX = (cpi->enc_quant_dequant_params).quants.v_quant[iVar3];
    x->plane[2].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.v_quant_fp[iVar3];
    x->plane[2].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.v_round_fp[iVar3];
    x->plane[2].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.v_quant_shift[iVar3];
    x->plane[2].zbin_QTX = (cpi->enc_quant_dequant_params).quants.v_zbin[iVar3];
    x->plane[2].round_QTX = (cpi->enc_quant_dequant_params).quants.v_round[iVar3];
    x->plane[2].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.v_dequant_QTX[iVar3];
  }
  quant_params = &(cpi->common).quant_params;
  if ((x->prev_segment_id != segment_id) ||
     (_Var2 = av1_use_qmatrix(quant_params,&x->e_mbd,segment_id), _Var2)) {
    _Var2 = av1_use_qmatrix(quant_params,&x->e_mbd,segment_id);
    if (_Var2) {
      local_40._0_4_ = (cpi->common).quant_params.qmatrix_level_y;
      local_40._4_4_ = (cpi->common).quant_params.qmatrix_level_u;
      local_38 = (cpi->common).quant_params.qmatrix_level_v;
    }
    else {
      local_40 = 0xf0000000f;
      local_38 = 0xf;
    }
    paapqVar12 = (cpi->common).quant_params.gqmatrix;
    __dest = (x->e_mbd).plane[0].seg_iqmatrix + segment_id;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      lVar8 = (long)*(int *)((long)&local_40 + lVar11 * 4);
      memcpy(__dest + 8,paapqVar12 + lVar8,0x98);
      memcpy(__dest,paapqVar12 + lVar8 + -0x10,0x98);
      paapqVar12 = (qm_val_t *(*) [3] [19])(*paapqVar12 + 1);
      __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
    }
  }
  if (seg->enabled == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = (cpi->common).seg.feature_mask[segment_id & 0xff] >> 6 & 1;
  }
  x->seg_skip_block = uVar6;
  iVar7 = 1;
  if (1 < iVar5 >> 6) {
    iVar7 = iVar5 >> 6;
  }
  x->errorperbit = iVar7;
  av1_set_sad_per_bit(cpi,&x->sadperbit,iVar4);
  x->prev_segment_id = segment_id;
  return;
}

Assistant:

void av1_init_plane_quantizers(const AV1_COMP *cpi, MACROBLOCK *x,
                               int segment_id, const int do_update) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonQuantParams *const quant_params = &cm->quant_params;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  int qindex_rd;

  const int current_qindex = AOMMAX(
      0,
      AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                   ? quant_params->base_qindex + x->delta_qindex
                                   : quant_params->base_qindex));
  const int qindex = av1_get_qindex(&cm->seg, segment_id, current_qindex);

  if (cpi->oxcf.sb_qp_sweep) {
    const int current_rd_qindex =
        AOMMAX(0, AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                               ? quant_params->base_qindex +
                                                     x->rdmult_delta_qindex
                                               : quant_params->base_qindex));
    qindex_rd = av1_get_qindex(&cm->seg, segment_id, current_rd_qindex);
  } else {
    qindex_rd = qindex;
  }

  const int qindex_rdmult = qindex_rd + quant_params->y_dc_delta_q;
  const int rdmult = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int qindex_change = x->qindex != qindex;
  if (qindex_change || do_update) {
    set_q_index(&cpi->enc_quant_dequant_params, qindex, x);
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  if ((segment_id != x->prev_segment_id) ||
      av1_use_qmatrix(quant_params, xd, segment_id)) {
    set_qmatrix(quant_params, segment_id, xd);
  }

  x->seg_skip_block = segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP);

  av1_set_error_per_bit(&x->errorperbit, rdmult);
  av1_set_sad_per_bit(cpi, &x->sadperbit, qindex_rd);

  x->prev_segment_id = segment_id;
}